

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

void __thiscall
covenant::DFA<covenant::Sym>::transition(DFA<covenant::Sym> *this,State s,Sym *val,State r)

{
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  *this_00;
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  *pvVar1;
  value_type *__x;
  uint in_ECX;
  Sym *in_RDX;
  uint in_ESI;
  DFA<covenant::Sym> *in_RDI;
  value_type *in_stack_ffffffffffffff88;
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  *in_stack_ffffffffffffff90;
  
  while( true ) {
    this_00 = (vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
               *)(ulong)in_ESI;
    pvVar1 = (vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              *)std::
                vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                ::size(&in_RDI->trans);
    if (this_00 < pvVar1) break;
    in_stack_ffffffffffffff90 = &in_RDI->trans;
    std::
    vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
    ::vector((vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              *)0x1fdcb2);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::
    vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
    ::~vector(this_00);
  }
  __x = (value_type *)
        std::
        vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ::operator[](&in_RDI->trans,(ulong)in_ESI);
  mk_edge(in_RDI,in_RDX,in_ECX);
  std::
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>::
  push_back((vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
             *)in_stack_ffffffffffffff90,__x);
  return;
}

Assistant:

void transition(State s, const V& val, State r) 
    {
      while( s.id >= trans.size() )
        trans.push_back( vector<Edge>() );
      
      trans[s.id].push_back( mk_edge(val, r.id) );
    }